

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O0

void burstsort2_sampling_brodnik(uchar **strings,size_t n)

{
  TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *root_00;
  TrieNode<unsigned_char,_vector_brodnik<unsigned_char_*>_> *root;
  size_t n_local;
  uchar **strings_local;
  
  root_00 = pseudo_sample<unsigned_char,vector_brodnik<unsigned_char*>>(strings,n);
  insert<16384u,vector_brodnik<unsigned_char*>,BurstSimple<unsigned_char>,unsigned_char>
            (root_00,strings,n);
  traverse<void(*)(unsigned_char**,int,int),vector_brodnik<unsigned_char*>,unsigned_char>
            (root_00,strings,0,mkqsort);
  return;
}

Assistant:

void burstsort2_sampling_brodnik(unsigned char** strings, size_t n)
{
	typedef unsigned char CharT;
	typedef vector_brodnik<unsigned char*> BucketT;
	typedef BurstSimple<CharT> BurstImpl;
	TrieNode<CharT, BucketT>* root = pseudo_sample<CharT, BucketT>(strings, n);
	insert<16384, BucketT, BurstImpl>(root, strings, n);
	traverse(root, strings, 0, SmallSort);
}